

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::ElementPIndexed
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 scopeIndex,uint cacheId)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  FunctionBody *this_00;
  RegSlot local_40;
  CacheId local_3c;
  uint32 local_38;
  uint32 local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x37);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_34 = cacheId;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x805,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00893057;
    *puVar3 = 0;
    cacheId = local_34;
  }
  if (value != 0xffffffff) {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      local_34 = scopeIndex;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00893057;
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
      scopeIndex = local_34;
    }
    value_00 = FunctionBody::MapRegSlot(this_00,value);
    if (((0x1a < op - 0x113) || ((0x6000001U >> (op - 0x113 & 0x1f) & 1) == 0)) &&
       (op != InitUndeclLetFld)) {
      AssertCount = AssertCount + 1;
      local_34 = cacheId;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x813,"(false)",
                                  "The specified OpCode not intended for base-less patchable inner field access"
                                 );
      if (!bVar2) goto LAB_00893057;
      *puVar3 = 0;
      cacheId = local_34;
    }
    bVar2 = TryWriteElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,op,value_00,scopeIndex,cacheId);
    if (!bVar2) {
      bVar2 = TryWriteElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,op,value_00,scopeIndex,cacheId);
      if (!bVar2) {
        local_40 = value_00;
        local_3c = cacheId;
        local_38 = scopeIndex;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
        Data::Write(&this->m_byteCodeData,&local_40,0xc);
      }
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_00893057:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ElementPIndexed(OpCode op, RegSlot value, uint32 scopeIndex, uint cacheId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementPIndexed);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        switch (op)
        {
        case OpCode::InitInnerFld:
        case OpCode::InitInnerLetFld:
        case OpCode::InitUndeclLetFld:
        case OpCode::InitUndeclConstFld:
            break;

            break;

        default:
            AssertMsg(false, "The specified OpCode not intended for base-less patchable inner field access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementPIndexed, op, value, scopeIndex, cacheId);
    }